

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_vector.h
# Opt level: O0

void __thiscall
spvtools::utils::SmallVector<unsigned_int,_2UL>::SmallVector
          (SmallVector<unsigned_int,_2UL> *this,initializer_list<unsigned_int> init_list)

{
  size_t sVar1;
  const_iterator puVar2;
  size_type sVar3;
  const_iterator puVar4;
  unique_ptr<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_30;
  const_iterator local_28;
  const_iterator it;
  SmallVector<unsigned_int,_2UL> *this_local;
  initializer_list<unsigned_int> init_list_local;
  
  init_list_local._M_array = (iterator)init_list._M_len;
  this_local = (SmallVector<unsigned_int,_2UL> *)init_list._M_array;
  it = (const_iterator)this;
  SmallVector(this);
  sVar3 = std::initializer_list<unsigned_int>::size((initializer_list<unsigned_int> *)&this_local);
  if (sVar3 < 2) {
    for (local_28 = std::initializer_list<unsigned_int>::begin
                              ((initializer_list<unsigned_int> *)&this_local); puVar2 = local_28,
        puVar4 = std::initializer_list<unsigned_int>::end
                           ((initializer_list<unsigned_int> *)&this_local), puVar2 != puVar4;
        local_28 = local_28 + 1) {
      sVar1 = this->size_;
      this->size_ = sVar1 + 1;
      this->small_data_[sVar1] = *local_28;
    }
  }
  else {
    MakeUnique<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::initializer_list<unsigned_int>>
              ((spvtools *)&local_30,(initializer_list<unsigned_int> *)&this_local);
    std::
    unique_ptr<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ::operator=(&this->large_data_,&local_30);
    std::
    unique_ptr<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ::~unique_ptr(&local_30);
  }
  return;
}

Assistant:

SmallVector(std::initializer_list<T> init_list) : SmallVector() {
    if (init_list.size() < small_size) {
      for (auto it = init_list.begin(); it != init_list.end(); ++it) {
        new (small_data_ + (size_++)) T(std::move(*it));
      }
    } else {
      large_data_ = MakeUnique<std::vector<T>>(std::move(init_list));
    }
  }